

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::UnshiftHelper<void*>
               (JavascriptArray *pArr,uint32 unshiftElements,Var *elements)

{
  uint uVar1;
  bool hasNoMissingValues_00;
  SparseArraySegmentBase **ppSVar2;
  SparseArraySegmentBase *this;
  SparseArraySegmentBase *pSVar3;
  bool hasNoMissingValues;
  uint32 oldHeadLength;
  SparseArraySegment<void_*> *head;
  Var *elements_local;
  uint32 unshiftElements_local;
  JavascriptArray *pArr_local;
  
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pArr->head);
  this = &SparseArraySegment<void_*>::From(*ppSVar2)->super_SparseArraySegmentBase;
  pSVar3 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
  Memory::MoveArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((WriteBarrierPtr<void> *)(&this[1].left + (ulong)unshiftElements * 2),
             (WriteBarrierPtr<void> *)(this + 1),(ulong)pSVar3->length);
  uVar1 = this->length;
  this->length = unshiftElements + this->length;
  SparseArraySegmentBase::CheckLengthvsSize(this);
  InvalidateLastUsedSegment(pArr);
  hasNoMissingValues_00 = HasNoMissingValues(pArr);
  if (uVar1 < unshiftElements) {
    SetHasNoMissingValues(pArr,false);
  }
  (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x76])
            (pArr,(ulong)unshiftElements,0,elements,0,1);
  SetHasNoMissingValues(pArr,hasNoMissingValues_00);
  return;
}

Assistant:

void JavascriptArray::UnshiftHelper(JavascriptArray* pArr, uint32 unshiftElements, Js::Var * elements)
    {
        SparseArraySegment<T>* head = SparseArraySegment<T>::From(pArr->head);
        // Make enough room in the head segment to insert new elements at the front
        MoveArray(head->elements + unshiftElements, head->elements, pArr->head->length);
        uint32 oldHeadLength = head->length;
        head->length += unshiftElements;
        head->CheckLengthvsSize();

        /* Set head segment as the last used segment */
        pArr->InvalidateLastUsedSegment();

        bool hasNoMissingValues = pArr->HasNoMissingValues();

        /* Set HasNoMissingValues to false -> Since we shifted elements right, we might have missing values after the memmove */
        if(unshiftElements > oldHeadLength)
        {
            pArr->SetHasNoMissingValues(false);
        }

#if ENABLE_PROFILE_INFO
        pArr->FillFromArgs(unshiftElements, 0, elements, nullptr, true/*dontCreateNewArray*/);
#else
        pArr->FillFromArgs(unshiftElements, 0, elements, true/*dontCreateNewArray*/);
#endif

        // Setting back to the old value
        pArr->SetHasNoMissingValues(hasNoMissingValues);
    }